

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_9ead9::ExprComparator::VisitImplication(ExprComparator *this,ImplicationExpr e)

{
  bool bVar1;
  ExprComparator *in_stack_00000058;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
  in_stack_00000060;
  
  bVar1 = (anonymous_namespace)::ExprComparator::
          VisitIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
                    (in_stack_00000058,in_stack_00000060);
  return bVar1;
}

Assistant:

bool VisitImplication(ImplicationExpr e) { return VisitIf(e); }